

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demand_queue.hpp
# Opt level: O2

void __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t::~demand_queue_t
          (demand_queue_t *this)

{
  queue_for_one_priority_t *q;
  long lVar1;
  
  for (lVar1 = 0x18; lVar1 != 0x218; lVar1 = lVar1 + 0x40) {
    cleanup_queue(this,(queue_for_one_priority_t *)((long)this->m_priorities + lVar1 + -0x18));
  }
  lVar1 = 0x1d8;
  do {
    event_queue_t::~event_queue_t((event_queue_t *)((long)this->m_priorities + lVar1 + -0x18));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x28);
  std::
  unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  ::~unique_ptr(&this->m_lock);
  return;
}

Assistant:

~demand_queue_t()
			{
				for( auto & q : m_priorities )
					cleanup_queue( q );
			}